

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::ungrabMouse(QGraphicsScenePrivate *this,QGraphicsItem *item,bool itemIsDying)

{
  ulong uVar1;
  qsizetype *pqVar2;
  long lVar3;
  QGraphicsItem **ppQVar4;
  QGraphicsWidget *widget;
  long lVar5;
  QGraphicsItem *pQVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->mouseGrabberItems).d.size;
  if (lVar3 == 0) {
LAB_00600570:
    ungrabMouse();
  }
  else {
    ppQVar4 = (this->mouseGrabberItems).d.ptr;
    lVar7 = 0;
    uVar8 = 0xfffffffffffffff8;
    do {
      if (lVar3 * -8 + uVar8 == -8) goto LAB_00600570;
      lVar7 = lVar7 + 0x100000000;
      uVar1 = uVar8 + 8;
      lVar5 = uVar8 + 8;
      uVar8 = uVar1;
    } while (*(QGraphicsItem **)((long)ppQVar4 + lVar5) != item);
    if ((int)(~uVar1 >> 3) == 0) goto LAB_00600570;
    if (ppQVar4[lVar3 + -1] != item) {
      ungrabMouse(this,*(QGraphicsItem **)((long)ppQVar4 + (lVar7 >> 0x1d)),itemIsDying);
    }
    lVar3 = (this->popupWidgets).d.size;
    if (lVar3 != 0) {
      widget = (this->popupWidgets).d.ptr[lVar3 + -1];
      pQVar6 = &(widget->super_QGraphicsObject).super_QGraphicsItem;
      if (widget == (QGraphicsWidget *)0x0) {
        pQVar6 = (QGraphicsItem *)0x0;
      }
      if (pQVar6 == item) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          removePopup(this,widget,itemIsDying);
          return;
        }
        goto LAB_00600592;
      }
    }
    if (itemIsDying) {
      QList<QGraphicsItem_*>::end(&this->mouseGrabberItems);
      pqVar2 = &(this->mouseGrabberItems).d.size;
      *pqVar2 = *pqVar2 + -1;
      this->field_0xb9 = this->field_0xb9 & 0xf7;
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,UngrabMouse);
      sendEvent(this,item,(QEvent *)&local_48);
      QEvent::~QEvent((QEvent *)&local_48);
      QList<QGraphicsItem_*>::end(&this->mouseGrabberItems);
      lVar3 = (this->mouseGrabberItems).d.size;
      this->field_0xb9 = this->field_0xb9 & 0xf7;
      lVar7 = lVar3 + -1;
      (this->mouseGrabberItems).d.size = lVar7;
      if (lVar7 != 0) {
        pQVar6 = (this->mouseGrabberItems).d.ptr[lVar3 + -2];
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_48,GrabMouse);
        sendEvent(this,pQVar6,(QEvent *)&local_48);
        QEvent::~QEvent((QEvent *)&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00600592:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::ungrabMouse(QGraphicsItem *item, bool itemIsDying)
{
    int index = mouseGrabberItems.indexOf(item);
    if (index == -1) {
        qWarning("QGraphicsItem::ungrabMouse: not a mouse grabber");
        return;
    }

    if (item != mouseGrabberItems.constLast()) {
        // Recursively ungrab the next mouse grabber until we reach this item
        // to ensure state consistency.
        ungrabMouse(mouseGrabberItems.at(index + 1), itemIsDying);
    }
    if (!popupWidgets.isEmpty() && item == popupWidgets.constLast()) {
        // If the item is a popup, go via removePopup to ensure state
        // consistency and that it gets hidden correctly - beware that
        // removePopup() reenters this function to continue removing the grab.
        removePopup(popupWidgets.constLast(), itemIsDying);
        return;
    }

    // Send notification about mouse ungrab.
    if (!itemIsDying) {
        QEvent event(QEvent::UngrabMouse);
        sendEvent(item, &event);
    }

    // Remove the item from the list of grabbers. Whenever this happens, we
    // reset the implicitGrab (there can be only ever be one implicit grabber
    // in a scene, and it is always the latest grabber; if the implicit grab
    // is lost, it is not automatically regained.
    mouseGrabberItems.takeLast();
    lastMouseGrabberItemHasImplicitMouseGrab = false;

    // Send notification about mouse regrab. ### It's unfortunate that all the
    // items get a GrabMouse event, but this is a rare case with a simple
    // implementation and it does ensure a consistent state.
    if (!itemIsDying && !mouseGrabberItems.isEmpty()) {
        QGraphicsItem *last = mouseGrabberItems.constLast();
        QEvent event(QEvent::GrabMouse);
        sendEvent(last, &event);
    }
}